

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O1

void __thiscall
slang::DiagnosticEngine::setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>
          (DiagnosticEngine *this,BufferID buffer,
          span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>
          directives,Diagnostics *diags)

{
  char_pointer puVar1;
  size_t *psVar2;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  char *pcVar5;
  size_t *__args;
  undefined4 uVar6;
  DiagCode *pDVar7;
  group_type_pointer pgVar8;
  group_type_pointer pgVar9;
  value_type_pointer ppVar10;
  ulong uVar11;
  value_type_pointer p;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  string_view name;
  string_view name_00;
  DiagnosticEngine *pDVar15;
  undefined8 uVar16;
  int iVar17;
  DiagGroup *pDVar18;
  ulong uVar19;
  long lVar20;
  char_pointer puVar21;
  Diagnostic *this_00;
  value_type_pointer ppVar22;
  value_type_pointer ppVar23;
  DiagnosticDirectiveInfo *directive;
  DiagCode *pDVar24;
  table_element_pointer ppVar25;
  ulong uVar26;
  ulong uVar27;
  short *__s1;
  char_pointer puVar28;
  uint uVar29;
  size_type __rlen;
  ulong uVar30;
  long lVar31;
  DiagnosticDirectiveInfo *pDVar32;
  uchar uVar33;
  char cVar34;
  uchar uVar36;
  char cVar37;
  uchar uVar38;
  char cVar39;
  uchar uVar40;
  char cVar41;
  undefined1 auVar35 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  span<const_slang::DiagCode,_18446744073709551615UL> sVar45;
  iterator iVar46;
  string_view arg;
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  mappingStack;
  locator res;
  anon_class_24_3_94aef59f noteDiag;
  try_emplace_args_t local_e5;
  BufferID local_e4;
  pair<const_slang::DiagCode,_slang::DiagnosticSeverity> local_e0;
  unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
  *local_d8;
  long local_d0;
  pointer local_c8;
  DiagnosticEngine *local_c0;
  undefined1 local_b8 [16];
  pointer puVar47;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
  *arrays_;
  locator local_78;
  Diagnostics *local_60;
  DiagnosticDirectiveInfo *local_58;
  DiagnosticDirectiveInfo *local_50;
  DiagnosticEngine *local_48;
  BufferID *local_40;
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  *local_38;
  
  directive = directives._M_ptr;
  local_b8 = (undefined1  [16])0x0;
  puVar47 = (pointer)0x0;
  local_e4.id = buffer.id;
  local_60 = diags;
  std::
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  ::emplace_back<>((vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                    *)local_b8);
  local_40 = &local_e4;
  local_c0 = this;
  local_48 = this;
  local_38 = (vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
              *)local_b8;
  if (directives._M_extent._M_extent_value._M_extent_value != 0) {
    pDVar32 = directive + directives._M_extent._M_extent_value._M_extent_value;
    arrays_ = (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
               *)&this->diagMappings;
    local_58 = pDVar32;
    do {
      uVar30 = (directive->name)._M_len;
      __s1 = (short *)(directive->name)._M_str;
      if (uVar30 == 7) {
        iVar17 = bcmp(__s1,"__pop__",7);
        if (iVar17 != 0) goto LAB_0063affc;
        local_c8 = (pointer)local_b8._0_8_;
        local_d0 = local_b8._8_8_ - local_b8._0_8_;
        if (1 < (ulong)((local_d0 >> 4) * -0x5555555555555555)) {
          iVar46 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                   ::begin((table<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                            *)(local_b8._8_8_ + -0x30));
          if (iVar46.p_ != (table_element_pointer)0x0) {
            __args = &directive->offset;
            local_50 = directive;
LAB_0063b0fd:
            pDVar15 = local_c0;
            local_e0 = *iVar46.p_;
            auVar13._8_8_ = 0;
            auVar13._0_8_ =
                 (ulong)local_e0 >> 0x10 & 0xffff | (ulong)(uint)((int)local_e0.first << 0x10);
            uVar26 = SUB168(auVar13 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                     SUB168(auVar13 * ZEXT816(0x9e3779b97f4a7c15),0);
            uVar19 = uVar26 >> ((byte)(local_c0->diagMappings).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                                      .arrays.groups_size_index & 0x3f);
            pgVar8 = (local_c0->diagMappings).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                     .arrays.groups_;
            uVar6 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar26 & 0xff];
            ppVar22 = (local_c0->diagMappings).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                      .arrays.elements_;
            local_d8 = (unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                        *)(local_c0->diagMappings).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                          .arrays.groups_size_mask;
            uVar27 = 0;
            uVar30 = uVar19;
            do {
              pgVar3 = pgVar8 + uVar30;
              uVar33 = (uchar)uVar6;
              auVar42[0] = -(pgVar3->m[0].n == uVar33);
              uVar36 = (uchar)((uint)uVar6 >> 8);
              auVar42[1] = -(pgVar3->m[1].n == uVar36);
              uVar38 = (uchar)((uint)uVar6 >> 0x10);
              auVar42[2] = -(pgVar3->m[2].n == uVar38);
              uVar40 = (uchar)((uint)uVar6 >> 0x18);
              auVar42[3] = -(pgVar3->m[3].n == uVar40);
              auVar42[4] = -(pgVar3->m[4].n == uVar33);
              auVar42[5] = -(pgVar3->m[5].n == uVar36);
              auVar42[6] = -(pgVar3->m[6].n == uVar38);
              auVar42[7] = -(pgVar3->m[7].n == uVar40);
              auVar42[8] = -(pgVar3->m[8].n == uVar33);
              auVar42[9] = -(pgVar3->m[9].n == uVar36);
              auVar42[10] = -(pgVar3->m[10].n == uVar38);
              auVar42[0xb] = -(pgVar3->m[0xb].n == uVar40);
              auVar42[0xc] = -(pgVar3->m[0xc].n == uVar33);
              auVar42[0xd] = -(pgVar3->m[0xd].n == uVar36);
              auVar42[0xe] = -(pgVar3->m[0xe].n == uVar38);
              auVar42[0xf] = -(pgVar3->m[0xf].n == uVar40);
              for (uVar29 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
                  uVar29 != 0; uVar29 = uVar29 - 1 & uVar29) {
                uVar12 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                if (local_e0.first == ppVar22[uVar30 * 0xf + (ulong)uVar12].first) {
                  ppVar22 = ppVar22 + uVar30 * 0xf + (ulong)uVar12;
                  goto LAB_0063b214;
                }
              }
              if ((pgVar8[uVar30].m[0xf].n &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(uint)uVar26 & 7]) == 0) break;
              lVar31 = uVar30 + uVar27;
              uVar27 = uVar27 + 1;
              uVar30 = lVar31 + 1U & (ulong)local_d8;
            } while (uVar27 <= local_d8);
            ppVar22 = (value_type_pointer)0x0;
LAB_0063b214:
            if (ppVar22 == (value_type_pointer)0x0) {
              if ((local_c0->diagMappings).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                  .size_ctrl.size <
                  (local_c0->diagMappings).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                  .size_ctrl.ml) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::DiagCode_const&>
                          (&local_78,arrays_,(arrays_type *)arrays_,uVar19,uVar26,&local_e5,
                           &local_e0.first);
                psVar2 = &(pDVar15->diagMappings).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                          .size_ctrl.size;
                *psVar2 = *psVar2 + 1;
                ppVar22 = local_78.p;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::DiagCode_const&>
                          (&local_78,arrays_,uVar26,&local_e5,&local_e0.first);
                ppVar22 = local_78.p;
              }
            }
            local_d8 = &ppVar22->second;
            uVar27 = SUB168(ZEXT416(local_e4.id) * ZEXT816(0x9e3779b97f4a7c15),8) ^
                     SUB168(ZEXT416(local_e4.id) * ZEXT816(0x9e3779b97f4a7c15),0);
            uVar19 = uVar27 >> ((byte)(ppVar22->second).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                                      .arrays.groups_size_index & 0x3f);
            pgVar9 = (ppVar22->second).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                     .arrays.groups_;
            uVar6 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar27 & 0xff];
            uVar26 = 0;
            uVar30 = uVar19;
            do {
              pgVar4 = pgVar9 + uVar30;
              uVar33 = (uchar)uVar6;
              auVar43[0] = -(pgVar4->m[0].n == uVar33);
              uVar36 = (uchar)((uint)uVar6 >> 8);
              auVar43[1] = -(pgVar4->m[1].n == uVar36);
              uVar38 = (uchar)((uint)uVar6 >> 0x10);
              auVar43[2] = -(pgVar4->m[2].n == uVar38);
              uVar40 = (uchar)((uint)uVar6 >> 0x18);
              auVar43[3] = -(pgVar4->m[3].n == uVar40);
              auVar43[4] = -(pgVar4->m[4].n == uVar33);
              auVar43[5] = -(pgVar4->m[5].n == uVar36);
              auVar43[6] = -(pgVar4->m[6].n == uVar38);
              auVar43[7] = -(pgVar4->m[7].n == uVar40);
              auVar43[8] = -(pgVar4->m[8].n == uVar33);
              auVar43[9] = -(pgVar4->m[9].n == uVar36);
              auVar43[10] = -(pgVar4->m[10].n == uVar38);
              auVar43[0xb] = -(pgVar4->m[0xb].n == uVar40);
              auVar43[0xc] = -(pgVar4->m[0xc].n == uVar33);
              auVar43[0xd] = -(pgVar4->m[0xd].n == uVar36);
              auVar43[0xe] = -(pgVar4->m[0xe].n == uVar38);
              auVar43[0xf] = -(pgVar4->m[0xf].n == uVar40);
              uVar29 = (uint)(ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe);
              if (uVar29 != 0) {
                ppVar10 = (ppVar22->second).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                          .arrays.elements_;
                do {
                  iVar17 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
                    }
                  }
                  if (local_e4.id ==
                      *(uint *)((long)&ppVar10[uVar30 * 0xf].first.id + (ulong)(uint)(iVar17 << 5)))
                  {
                    ppVar23 = (value_type_pointer)
                              ((long)&ppVar10[uVar30 * 0xf].first.id + (ulong)(uint)(iVar17 << 5));
                    goto LAB_0063b35e;
                  }
                  uVar29 = uVar29 - 1 & uVar29;
                } while (uVar29 != 0);
              }
              if ((pgVar9[uVar30].m[0xf].n &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(uint)uVar27 & 7]) == 0) break;
              uVar11 = (ppVar22->second).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                       .arrays.groups_size_mask;
              lVar31 = uVar30 + uVar26;
              uVar26 = uVar26 + 1;
              uVar30 = lVar31 + 1U & uVar11;
            } while (uVar26 <= uVar11);
            ppVar23 = (value_type_pointer)0x0;
LAB_0063b35e:
            if (ppVar23 == (value_type_pointer)0x0) {
              if ((ppVar22->second).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                  .size_ctrl.size <
                  (ppVar22->second).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                  .size_ctrl.ml) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID_const&>
                          ((locator *)&local_78,
                           (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
                            *)local_d8,(arrays_type *)local_d8,uVar19,uVar27,&local_e5,&local_e4);
                psVar2 = &(ppVar22->second).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                          .size_ctrl.size;
                *psVar2 = *psVar2 + 1;
                ppVar23 = local_78.p;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID_const&>
                          ((locator *)&local_78,
                           (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
                            *)local_d8,uVar27,&local_e5,&local_e4);
                ppVar23 = local_78.p;
              }
            }
            directive = local_50;
            pDVar32 = local_58;
            auVar14._8_8_ = 0;
            auVar14._0_8_ =
                 (ulong)local_e0 >> 0x10 & 0xffff | (ulong)(uint)((int)local_e0.first << 0x10);
            uVar19 = SUB168(auVar14 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                     SUB168(auVar14 * ZEXT816(0x9e3779b97f4a7c15),0);
            uVar30 = uVar19 >> (*(byte *)((long)&local_c8[-2].table_.
                                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                                                 .arrays.groups_size_index + local_d0) & 0x3f);
            lVar31 = *(long *)((long)local_c8 + local_d0 + -0x50);
            uVar6 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar19 & 0xff];
            uVar26 = 0;
            do {
              pcVar5 = (char *)(lVar31 + uVar30 * 0x10);
              cVar34 = (char)uVar6;
              auVar44[0] = -(*pcVar5 == cVar34);
              cVar37 = (char)((uint)uVar6 >> 8);
              auVar44[1] = -(pcVar5[1] == cVar37);
              cVar39 = (char)((uint)uVar6 >> 0x10);
              auVar44[2] = -(pcVar5[2] == cVar39);
              cVar41 = (char)((uint)uVar6 >> 0x18);
              auVar44[3] = -(pcVar5[3] == cVar41);
              auVar44[4] = -(pcVar5[4] == cVar34);
              auVar44[5] = -(pcVar5[5] == cVar37);
              auVar44[6] = -(pcVar5[6] == cVar39);
              auVar44[7] = -(pcVar5[7] == cVar41);
              auVar44[8] = -(pcVar5[8] == cVar34);
              auVar44[9] = -(pcVar5[9] == cVar37);
              auVar44[10] = -(pcVar5[10] == cVar39);
              auVar44[0xb] = -(pcVar5[0xb] == cVar41);
              auVar44[0xc] = -(pcVar5[0xc] == cVar34);
              auVar44[0xd] = -(pcVar5[0xd] == cVar37);
              auVar44[0xe] = -(pcVar5[0xe] == cVar39);
              auVar44[0xf] = -(pcVar5[0xf] == cVar41);
              uVar29 = (uint)(ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe);
              if (uVar29 != 0) {
                lVar20 = *(long *)((long)local_c8 + local_d0 + -0x48) + uVar30 * 0x78;
                do {
                  uVar12 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                    }
                  }
                  if (local_e0.first == *(DiagCode *)(lVar20 + (ulong)uVar12 * 8)) {
                    lVar20 = lVar20 + (ulong)uVar12 * 8;
                    goto LAB_0063b4c5;
                  }
                  uVar29 = uVar29 - 1 & uVar29;
                } while (uVar29 != 0);
              }
              if ((*(byte *)(uVar30 * 0x10 + lVar31 + 0xf) &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7]) == 0) break;
              uVar27 = *(ulong *)((long)local_c8 + local_d0 + -0x58);
              lVar20 = uVar30 + uVar26;
              uVar26 = uVar26 + 1;
              uVar30 = lVar20 + 1U & uVar27;
            } while (uVar26 <= uVar27);
            lVar20 = 0;
LAB_0063b4c5:
            if (lVar20 == 0) {
              std::
              vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
              ::emplace_back<unsigned_long_const&,std::nullopt_t_const&>
                        ((vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
                          *)&ppVar23->second,__args,(nullopt_t *)&std::nullopt);
            }
            else {
              std::
              vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
              ::emplace_back<unsigned_long_const&,slang::DiagnosticSeverity&>
                        ((vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
                          *)&ppVar23->second,__args,(DiagnosticSeverity *)(lVar20 + 4));
            }
            puVar21 = iVar46.pc_ + 2;
            do {
              puVar28 = puVar21;
              puVar21 = iVar46.pc_;
              ppVar25 = iVar46.p_ + 1;
              if (((uint)iVar46.pc_ & 0xf) == 0xe) goto LAB_0063b52f;
              puVar1 = puVar28 + -1;
              iVar46.p_ = ppVar25;
              iVar46.pc_ = puVar21 + 1;
              puVar21 = puVar28 + 1;
            } while (*puVar1 == '\0');
            puVar28 = puVar28 + -1;
            if (*puVar1 == '\x01') {
              ppVar25 = (table_element_pointer)0x0;
            }
            goto LAB_0063b51d;
          }
LAB_0063b615:
          uVar16 = local_b8._8_8_;
          local_b8._8_8_ = (pointer)(local_b8._8_8_ + -0x30);
          p = (((pointer)(uVar16 + -0x30))->table_).
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
              .arrays.elements_;
          if (p != (value_type_pointer)0x0) {
            operator_delete(p,(((pointer)(uVar16 + -0x30))->table_).
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                              .arrays.groups_size_mask * 0x88 + 0x90);
          }
        }
      }
      else if ((uVar30 == 8) && (iVar17 = bcmp(__s1,"__push__",8), iVar17 == 0)) {
        std::
        vector<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>,std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>>>
        ::
        emplace_back<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>&>
                  ((vector<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>,std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>>>
                    *)local_b8,
                   (unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                    *)(local_b8._8_8_ + -0x30));
      }
      else {
LAB_0063affc:
        if ((1 < uVar30) && (*__s1 == 0x572d)) {
          if (uVar30 < 2) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",2,uVar30);
          }
          uVar30 = uVar30 - 2;
          __s1 = __s1 + 1;
        }
        name._M_str = (char *)arrays_;
        name._M_len = (size_t)puVar47;
        pDVar18 = findDefaultDiagGroup(name);
        if (pDVar18 == (DiagGroup *)0x0) {
          name_00._M_str = (char *)arrays_;
          name_00._M_len = (size_t)puVar47;
          sVar45 = findDiagsFromOptionName(name_00);
          if (sVar45._M_extent._M_extent_value._M_extent_value == 0) {
            this_00 = Diagnostics::add(local_60,(DiagCode)0x1000f,
                                       (SourceLocation)
                                       (directive->offset << 0x1c | (ulong)(local_e4.id & 0xfffffff)
                                       ));
            arg._M_str = (char *)__s1;
            arg._M_len = uVar30;
            Diagnostic::operator<<(this_00,arg);
          }
          else {
            lVar31 = 0;
            do {
              setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>(slang::BufferID,std::span<slang::SourceManager::DiagnosticDirectiveInfo_const,18446744073709551615ul>,slang::Diagnostics&)
              ::{lambda(slang::DiagCode,auto:1&)#1}::operator()
                        (&local_48,*(DiagCode *)((long)&(sVar45._M_ptr)->subsystem + lVar31),
                         directive);
              lVar31 = lVar31 + 4;
            } while (sVar45._M_extent._M_extent_value._M_extent_value << 2 != lVar31);
          }
        }
        else {
          pDVar7 = (pDVar18->diags).
                   super__Vector_base<slang::DiagCode,_std::allocator<slang::DiagCode>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pDVar24 = (pDVar18->diags).
                         super__Vector_base<slang::DiagCode,_std::allocator<slang::DiagCode>_>.
                         _M_impl.super__Vector_impl_data._M_start; pDVar24 != pDVar7;
              pDVar24 = pDVar24 + 1) {
            setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>(slang::BufferID,std::span<slang::SourceManager::DiagnosticDirectiveInfo_const,18446744073709551615ul>,slang::Diagnostics&)
            ::{lambda(slang::DiagCode,auto:1&)#1}::operator()(&local_48,*pDVar24,directive);
          }
        }
      }
      directive = directive + 1;
    } while (directive != pDVar32);
  }
  std::
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  ::~vector((vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
             *)local_b8);
  return;
LAB_0063b52f:
  do {
    auVar35[0] = -(*puVar28 == '\0');
    auVar35[1] = -(puVar28[1] == '\0');
    auVar35[2] = -(puVar28[2] == '\0');
    auVar35[3] = -(puVar28[3] == '\0');
    auVar35[4] = -(puVar28[4] == '\0');
    auVar35[5] = -(puVar28[5] == '\0');
    auVar35[6] = -(puVar28[6] == '\0');
    auVar35[7] = -(puVar28[7] == '\0');
    auVar35[8] = -(puVar28[8] == '\0');
    auVar35[9] = -(puVar28[9] == '\0');
    auVar35[10] = -(puVar28[10] == '\0');
    auVar35[0xb] = -(puVar28[0xb] == '\0');
    auVar35[0xc] = -(puVar28[0xc] == '\0');
    auVar35[0xd] = -(puVar28[0xd] == '\0');
    auVar35[0xe] = -(puVar28[0xe] == '\0');
    auVar35[0xf] = -(puVar28[0xf] == '\0');
    uVar29 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
    if (uVar29 == 0x7fff) {
      puVar28 = puVar28 + 0x10;
      ppVar25 = ppVar25 + 0xf;
    }
    else {
      uVar12 = 0;
      if ((uVar29 ^ 0x7fff) != 0) {
        for (; ((uVar29 ^ 0x7fff) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
        }
      }
      if (puVar28[uVar12] == '\x01') {
        ppVar25 = (table_element_pointer)0x0;
      }
      else {
        puVar28 = puVar28 + uVar12;
        ppVar25 = ppVar25 + uVar12;
      }
    }
  } while (uVar29 == 0x7fff);
LAB_0063b51d:
  iVar46.p_ = ppVar25;
  iVar46.pc_ = puVar28;
  if (ppVar25 == (table_element_pointer)0x0) goto LAB_0063b615;
  goto LAB_0063b0fd;
}

Assistant:

void DiagnosticEngine::setMappingsFromPragmasImpl(BufferID buffer,
                                                  std::span<const TDirective> directives,
                                                  Diagnostics& diags) {

    // Store the state of diagnostics each time the user pushes,
    // and restore the state when they pop.
    std::vector<flat_hash_map<DiagCode, DiagnosticSeverity>> mappingStack;
    mappingStack.emplace_back();

    auto noteDiag = [&](DiagCode code, auto& directive) {
        diagMappings[code][buffer].emplace_back(directive.offset, directive.severity);
        mappingStack.back()[code] = directive.severity;
    };

    for (const SourceManager::DiagnosticDirectiveInfo& directive : directives) {
        auto name = directive.name;
        if (name == "__push__") {
            mappingStack.emplace_back(mappingStack.back());
        }
        else if (name == "__pop__") {
            // If the stack size is 1, push was never called, so just ignore.
            if (mappingStack.size() <= 1)
                continue;

            // Any directives that were set revert to their previous values.
            // If there is no previous value, they go back to the default (unset).
            auto& prev = mappingStack[mappingStack.size() - 2];
            for (auto [code, _] : mappingStack.back()) {
                auto& mappings = diagMappings[code][buffer];
                if (auto it = prev.find(code); it != prev.end())
                    mappings.emplace_back(directive.offset, it->second);
                else
                    mappings.emplace_back(directive.offset, std::nullopt);
            }
            mappingStack.pop_back();
        }
        else {
            if (name.starts_with("-W"sv))
                name = name.substr(2);

            if (auto group = findDiagGroup(name)) {
                for (auto code : group->getDiags())
                    noteDiag(code, directive);
            }
            else if (auto codes = findFromOptionName(name); !codes.empty()) {
                for (auto code : codes)
                    noteDiag(code, directive);
            }
            else {
                auto& diag = diags.add(diag::UnknownWarningOption,
                                       SourceLocation(buffer, directive.offset));
                diag << name;
            }
        }
    }
}